

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamEuler.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamEuler::ComputeNF
          (ChElementBeamEuler *this,double U,ChVectorDynamic<> *Qi,double *detJ,ChVectorDynamic<> *F
          ,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  CoeffReturnType pdVar10;
  Scalar *pSVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ShapeVector N;
  
  ShapeFunctions(this,&N,U);
  *detJ = (this->super_ChElementBeam).length * 0.5;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,0);
  dVar1 = *pdVar10;
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,0);
  *pSVar11 = N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
             [0] * dVar1;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,1);
  dVar1 = *pdVar10;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,5);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar1;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
                 array[1];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[6] *
       *pdVar10;
  auVar2 = vfmadd231sd_fma(auVar20,auVar12,auVar2);
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,1);
  *pSVar11 = auVar2._0_8_;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,2);
  dVar1 = *pdVar10;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,4);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
                 array[1];
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[6] *
       *pdVar10;
  auVar2 = vfmsub231sd_fma(auVar21,auVar13,auVar3);
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,2);
  *pSVar11 = auVar2._0_8_;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,3);
  dVar1 = *pdVar10;
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,3);
  *pSVar11 = N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
             [0] * dVar1;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,2);
  dVar1 = *pdVar10;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,4);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
                 array[2];
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[8] *
       *pdVar10;
  auVar2 = vfnmadd231sd_fma(auVar22,auVar14,auVar4);
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,4);
  *pSVar11 = auVar2._0_8_;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,1);
  dVar1 = *pdVar10;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,5);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar1;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
                 array[2];
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[8] *
       *pdVar10;
  auVar2 = vfmadd231sd_fma(auVar23,auVar15,auVar5);
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,5);
  *pSVar11 = auVar2._0_8_;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,0);
  dVar1 = *pdVar10;
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,6);
  *pSVar11 = N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
             [3] * dVar1;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,1);
  dVar1 = *pdVar10;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,5);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
                 array[4];
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[7] *
       *pdVar10;
  auVar2 = vfmadd231sd_fma(auVar24,auVar16,auVar6);
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,7);
  *pSVar11 = auVar2._0_8_;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,2);
  dVar1 = *pdVar10;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,4);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
                 array[4];
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[7] *
       *pdVar10;
  auVar2 = vfmsub231sd_fma(auVar17,auVar25,auVar7);
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,8);
  *pSVar11 = auVar2._0_8_;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,3);
  dVar1 = *pdVar10;
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,9);
  *pSVar11 = N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array
             [3] * dVar1;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,2);
  dVar1 = *pdVar10;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,4);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
                 array[5];
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[9] *
       *pdVar10;
  auVar2 = vfnmadd231sd_fma(auVar26,auVar18,auVar8);
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,10);
  *pSVar11 = auVar2._0_8_;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,1);
  dVar1 = *pdVar10;
  pdVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)F,5);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
                 array[5];
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       N.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.array[9] *
       *pdVar10;
  auVar2 = vfmadd231sd_fma(auVar19,auVar27,auVar9);
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qi,0xb);
  *pSVar11 = auVar2._0_8_;
  return;
}

Assistant:

void ChElementBeamEuler::ComputeNF(const double U,
                                   ChVectorDynamic<>& Qi,
                                   double& detJ,
                                   const ChVectorDynamic<>& F,
                                   ChVectorDynamic<>* state_x,
                                   ChVectorDynamic<>* state_w) {
    ShapeVector N;
    ShapeFunctions(N, U);  // evaluate shape functions (in compressed vector), btw. not dependant on state

    detJ = this->GetRestLength() / 2.0;

    Qi(0) = N(0) * F(0);
    Qi(1) = N(1) * F(1) + N(6) * F(5);
    Qi(2) = N(1) * F(2) - N(6) * F(4);
    Qi(3) = N(0) * F(3);
    Qi(4) = -N(2) * F(2) + N(8) * F(4);
    Qi(5) = N(2) * F(1) + N(8) * F(5);

    Qi(6) = N(3) * F(0);
    Qi(7) = N(4) * F(1) + N(7) * F(5);
    Qi(8) = N(4) * F(2) - N(7) * F(4);
    Qi(9) = N(3) * F(3);
    Qi(10) = -N(5) * F(2) + N(9) * F(4);
    Qi(11) = N(5) * F(1) + N(9) * F(5);
}